

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O3

const_iterator * __thiscall
pstore::index::
hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
::find<pstore::uint128,void>
          (const_iterator *__return_storage_ptr__,
          hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
          *this,database *db,uint128 *key)

{
  long lVar1;
  bool bVar2;
  key_type *pkVar3;
  address addr;
  unsigned_long uVar4;
  long extraout_RDX;
  uint uVar5;
  ulong uVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *phVar7;
  index_pointer node;
  internal_node *piVar8;
  index_pointer db_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar9;
  parent_stack parents;
  pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
  local_138;
  const_iterator *local_120;
  hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
  *local_118;
  uint128 *local_110;
  index_pointer local_108 [26];
  ulong local_38;
  
  addr.a_ = (value_type)key;
  bVar2 = hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          ::empty((hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                   *)this);
  if (bVar2) {
    memset(&__return_storage_ptr__->visited_parents_,0,0xd8);
    __return_storage_ptr__->db_ = db;
    __return_storage_ptr__->index_ =
         (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          *)this;
    (__return_storage_ptr__->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
    ._M_head_impl = (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)0x0;
  }
  else {
    uVar6 = *(ulong *)((long)&key->v_ + 8);
    db_00 = *(index_pointer *)(this + 0x18);
    uVar5 = 0;
    local_120 = __return_storage_ptr__;
    local_118 = (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                 *)this;
    local_110 = key;
    memset(local_108,0,0xd8);
    if (((ulong)db_00.internal_ & 1) == 0) {
      this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      node = db_00;
      this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        if (uVar5 < 0x42) {
          details::internal_node::get_node(&local_138,db,node);
          this_00._M_pi =
               local_138.first.
               super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_138.first.
          super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_138.first.
          super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          piVar8 = local_138.second;
          if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
             piVar8 = local_138.second,
             local_138.first.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_138.first.
                       super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          if ((piVar8->bitmap_ >> (uVar6 & 0x3f) & 1) == 0) {
LAB_0011ae8f:
            __return_storage_ptr__ = local_120;
            memset(&local_120->visited_parents_,0,0xd8);
            __return_storage_ptr__->db_ = db;
            phVar7 = local_118;
            goto LAB_0011aeb4;
          }
          uVar4 = POPCOUNT(piVar8->bitmap_ & (1L << ((byte)uVar6 & 0x3f)) - 1U);
          pVar9.second = uVar4;
          pVar9.first.internal_ = piVar8->children_[uVar4].internal_;
        }
        else {
          details::linear_node::get_node
                    ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                      *)&local_138,db,node);
          this_00._M_pi =
               local_138.first.
               super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
          local_138.first.
          super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_138.first.
          super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          piVar8 = local_138.second;
          if ((this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01),
             piVar8 = local_138.second,
             local_138.first.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_138.first.
                       super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi);
          }
          pVar9 = details::linear_node::
                  lookup<pstore::uint128,pstore::uint128,std::equal_to<pstore::uint128>,void>
                            ((linear_node *)piVar8,db,local_110);
          if (pVar9.second == 0xffffffffffffffff) goto LAB_0011ae8f;
        }
        db_00 = pVar9.first;
        if (0xc < local_38) {
          assert_failed("elements_ < Size",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                        ,100);
        }
        addr.a_ = local_38 + 1;
        local_108[local_38 * 2] = node;
        lVar1 = local_38 * 2;
        local_38 = addr.a_;
        local_108[lVar1 + 1] = (index_pointer)pVar9.second;
        uVar5 = uVar5 + 6;
        uVar6 = uVar6 >> 6;
        node = db_00;
        this_01 = this_00._M_pi;
      } while (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
    }
    phVar7 = local_118;
    if (((ulong)db_00.internal_ & 2) != 0) {
      __assert_fail("is_address ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map_types.hpp"
                    ,0xe3,"address pstore::index::details::index_pointer::to_address() const");
    }
    pkVar3 = hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
             ::get_key((key_type *)local_118,
                       (hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                        *)db,(database *)db_00.internal_,addr);
    __return_storage_ptr__ = local_120;
    if (extraout_RDX == *(long *)((long)&local_110->v_ + 8) &&
        pkVar3 == *(key_type **)&local_110->v_) {
      if (0xc < local_38) {
        assert_failed("elements_ < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/array_stack.hpp"
                      ,100);
      }
      local_108[local_38 * 2] = db_00;
      lVar1 = local_38 * 2;
      local_38 = local_38 + 1;
      local_108[lVar1 + 1] = (index_pointer)0xffffffffffffffff;
      local_120->db_ = db;
      memcpy(&local_120->visited_parents_,local_108,0xd8);
    }
    else {
      memset(&local_120->visited_parents_,0,0xd8);
      __return_storage_ptr__->db_ = db;
    }
LAB_0011aeb4:
    __return_storage_ptr__->index_ = phVar7;
    (__return_storage_ptr__->pos_)._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<unsigned_char>_>_*,_false>
    ._M_head_impl = (pair<const_pstore::uint128,_pstore::extent<unsigned_char>_> *)0x0;
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto hamt_map<KeyType, ValueType, Hash, KeyEqual>::find (database const & db,
                                                                 OtherKeyType const & key) const
            -> const_iterator {
            if (empty ()) {
                return this->cend (db);
            }

            auto hash = static_cast<hash_type> (hash_ (key));
            unsigned bit_shifts = 0;
            index_pointer node = root_;
            parent_stack parents;

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                index_pointer child_node;
                auto index = std::size_t{0};

                if (details::depth_is_internal_node (bit_shifts)) {
                    // It's an internal node.
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db, node);
                    std::tie (child_node, index) =
                        internal->lookup (hash & details::hash_index_mask);
                } else {
                    // It's a linear node.
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db, node);
                    std::tie (child_node, index) = linear->lookup<KeyType> (db, key, equal_);
                }

                if (index == details::not_found) {
                    return this->cend (db);
                }
                parents.push (details::parent_type{node, index});

                // Go to next sub-trie level
                node = child_node;
                bit_shifts += details::hash_index_bits;
                hash >>= details::hash_index_bits;
            }
            // It's a leaf node.
            PSTORE_ASSERT (node.is_leaf ());
            key_type const existing_key = get_key (db, node.to_address ());
            if (equal_ (existing_key, key)) {
                parents.push (details::parent_type{node});
                return const_iterator (db, std::move (parents), this);
            }
            return this->cend (db);
        }